

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  char cVar1;
  complex<float> *__s;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_01654548;
  iVar5 = (mat->super_TPZBaseMatrix).fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (mat->super_TPZBaseMatrix).fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar5;
  cVar1 = (mat->super_TPZBaseMatrix).fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (mat->super_TPZBaseMatrix).fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar1;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01653fb8;
  this->fElem = (complex<float> *)0x0;
  this->fGiven = (complex<float> *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  iVar5 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  lVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  uVar2 = lVar3 * iVar5;
  if (uVar2 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    memset(__s,0,uVar2 * 8);
    this->fElem = __s;
    for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 1) {
      for (lVar3 = 0; lVar3 < iVar5; lVar3 = lVar3 + 1) {
        (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(mat,lVar3,lVar4);
        __s->_M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        __s = __s + 1;
        iVar5 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      }
      lVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZMatrix<TVar> &mat) : 
TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>(mat), fElem(0),fGiven(0),fSize(0) {
    if(this->fRow*this->fCol) {
        
        fElem = new TVar[this->fRow*this->fCol];
        TVar * p = fElem;
        int64_t i,j;
        for(j=0; j<this->fCol; j++) {
            for(i=0; i<this->fRow; i++) {
                *p++ = mat.GetVal(i,j);
            }
        }
    }
}